

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

size_t absl::lts_20250127::strings_internal::CalculateBase64EscapedLenInternal
                 (size_t input_len,bool do_padding)

{
  size_t sVar1;
  size_t local_98;
  size_t len;
  char *local_88;
  char *absl_raw_log_internal_filename;
  string local_78 [55];
  allocator<char> local_41;
  undefined1 local_40 [8];
  string death_message;
  size_t kMaxSize;
  bool do_padding_local;
  size_t input_len_local;
  
  death_message.field_2._8_8_ = 0xbffffffffffffffd;
  if (0xbffffffffffffffd < input_len) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"Check input_len <= kMaxSize failed: ",&local_41);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"CalculateBase64EscapedLenInternal() overflow",
               (allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
    std::__cxx11::string::operator+=((string *)local_40,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&absl_raw_log_internal_filename + 7))
    ;
    local_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/escaping.cc"
    ;
    len._4_4_ = 3;
    len._0_4_ = 0x2b;
    base_internal::
    AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
    ::operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                  *)raw_log_internal::internal_log_function_abi_cxx11_,
                 (LogSeverity *)((long)&len + 4),&local_88,(int *)&len,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/escaping.cc"
                  ,0x2b,
                  "size_t absl::strings_internal::CalculateBase64EscapedLenInternal(size_t, bool)");
  }
  sVar1 = (input_len / 3) * 4;
  local_98 = sVar1;
  if (input_len % 3 != 0) {
    if (input_len % 3 == 1) {
      local_98 = sVar1 + 2;
      if (do_padding) {
        local_98 = sVar1 + 4;
      }
    }
    else {
      local_98 = sVar1 + 3;
      if (do_padding) {
        local_98 = sVar1 + 4;
      }
    }
  }
  return local_98;
}

Assistant:

size_t CalculateBase64EscapedLenInternal(size_t input_len, bool do_padding) {
  // Base64 encodes three bytes of input at a time. If the input is not
  // divisible by three, we pad as appropriate.
  //
  // Base64 encodes each three bytes of input into four bytes of output.
  constexpr size_t kMaxSize = (std::numeric_limits<size_t>::max() - 1) / 4 * 3;
  ABSL_INTERNAL_CHECK(input_len <= kMaxSize,
                      "CalculateBase64EscapedLenInternal() overflow");
  size_t len = (input_len / 3) * 4;

  // Since all base 64 input is an integral number of octets, only the following
  // cases can arise:
  if (input_len % 3 == 0) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (1) the final quantum of encoding input is an integral multiple of 24
    // bits; here, the final unit of encoded output will be an integral
    // multiple of 4 characters with no "=" padding,
  } else if (input_len % 3 == 1) {
    // (from https://tools.ietf.org/html/rfc3548)
    // (2) the final quantum of encoding input is exactly 8 bits; here, the
    // final unit of encoded output will be two characters followed by two
    // "=" padding characters, or
    len += 2;
    if (do_padding) {
      len += 2;
    }
  } else {  // (input_len % 3 == 2)
    // (from https://tools.ietf.org/html/rfc3548)
    // (3) the final quantum of encoding input is exactly 16 bits; here, the
    // final unit of encoded output will be three characters followed by one
    // "=" padding character.
    len += 3;
    if (do_padding) {
      len += 1;
    }
  }

  return len;
}